

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::HeapBucketT
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  *(undefined8 *)((long)&(this->super_HeapBucket).sizeCat + 1) = 0;
  *(undefined8 *)((long)&(this->super_HeapBucket).newHeapBlockCount + 1) = 0;
  (this->super_HeapBucket).heapInfo = (HeapInfo *)0x0;
  (this->super_HeapBucket).sizeCat = 0;
  (this->super_HeapBucket).heapBlockCount = 0;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
  SmallHeapBlockAllocator(&this->allocatorHead);
  *(undefined8 *)((long)&this->lastExplicitFreeListAllocator + 1) = 0;
  *(undefined8 *)((long)&this->explicitFreeLockBlockList + 1) = 0;
  this->explicitFreeList = (FreeObject *)0x0;
  this->lastExplicitFreeListAllocator = (TBlockAllocatorType *)0x0;
  this->fullBlockList = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  this->heapBlockList = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  this->nextAllocableBlockHead = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  this->emptyBlockList = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  return;
}

Assistant:

HeapBucketT<TBlockType>::HeapBucketT() :
    nextAllocableBlockHead(nullptr),
    emptyBlockList(nullptr),
    fullBlockList(nullptr),
    heapBlockList(nullptr),
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    lastKnownNextAllocableBlockHead(nullptr),
    allocableHeapBlockListHead(nullptr),
    sweepableHeapBlockList(nullptr),
#endif
#endif
    explicitFreeList(nullptr),
    lastExplicitFreeListAllocator(nullptr)
{
#ifdef RECYCLER_PAGE_HEAP
    explicitFreeLockBlockList = nullptr;
#endif

    isAllocationStopped = false;
}